

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.h
# Opt level: O3

aiTexture * __thiscall aiScene::GetEmbeddedTexture(aiScene *this,char *filename)

{
  uint uVar1;
  int iVar2;
  char *__s2;
  char *__s1;
  long lVar3;
  ulong uVar4;
  aiTexture *paVar5;
  
  if (*filename == '*') {
    uVar1 = atoi(filename + 1);
    paVar5 = (aiTexture *)0x0;
    if ((-1 < (int)uVar1) && (uVar1 < this->mNumTextures)) {
      lVar3 = (ulong)uVar1 << 3;
LAB_00341d15:
      paVar5 = *(aiTexture **)(lVar3 + (long)this->mTextures);
    }
  }
  else {
    __s2 = GetShortFilename(filename);
    if (this->mNumTextures == 0) {
      paVar5 = (aiTexture *)0x0;
    }
    else {
      paVar5 = (aiTexture *)0x0;
      lVar3 = 0;
      uVar4 = 0;
      do {
        __s1 = GetShortFilename((char *)(*(long *)((long)this->mTextures + lVar3) + 0x24));
        iVar2 = strcmp(__s1,__s2);
        if (iVar2 == 0) goto LAB_00341d15;
        uVar4 = uVar4 + 1;
        lVar3 = lVar3 + 8;
      } while (uVar4 < this->mNumTextures);
    }
  }
  return paVar5;
}

Assistant:

const aiTexture* GetEmbeddedTexture(const char* filename) const {
        // lookup using texture ID (if referenced like: "*1", "*2", etc.)
        if ('*' == *filename) {
            int index = std::atoi(filename + 1);
            if (0 > index || mNumTextures <= static_cast<unsigned>(index))
                return nullptr;
            return mTextures[index];
        }
        // lookup using filename
        const char* shortFilename = GetShortFilename(filename);
        for (unsigned int i = 0; i < mNumTextures; i++) {
            const char* shortTextureFilename = GetShortFilename(mTextures[i]->mFilename.C_Str());
            if (strcmp(shortTextureFilename, shortFilename) == 0) {
                return mTextures[i];
            }
        }
        return nullptr;
    }